

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void resizable_cb(Fl_Light_Button *i,void *v)

{
  byte bVar1;
  int iVar2;
  
  if ((char *)v != "LOAD") {
    Fl_Widget_Type::resizable(current_widget,(i->super_Fl_Button).value_);
    set_modflag(1);
    return;
  }
  iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
  if ((iVar2 == 0) && (numselected < 2)) {
    Fl_Widget::activate((Fl_Widget *)i);
    bVar1 = Fl_Widget_Type::resizable(current_widget);
    Fl_Button::value(&i->super_Fl_Button,(uint)bVar1);
    return;
  }
  Fl_Widget::deactivate((Fl_Widget *)i);
  return;
}

Assistant:

void resizable_cb(Fl_Light_Button* i,void* v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;}
    if (numselected > 1) {i->deactivate(); return;}
    i->activate();
    i->value(current_widget->resizable());
  } else {
    current_widget->resizable(i->value());
    set_modflag(1);
  }
}